

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void G_WriteSnapshots(FILE *file)

{
  uint uVar1;
  FPNGChunkArchive *this;
  level_info_t *plVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  SBYTE cnum;
  FPNGChunkArchive arc3;
  BYTE local_329;
  FPNGChunkArchive local_328;
  
  if (wadlevelinfos.Count == 0) {
    uVar1 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    plVar2 = wadlevelinfos.Array;
    uVar1 = wadlevelinfos.Count;
    do {
      if (*(long *)((long)&plVar2->snapshot + lVar3) != 0) {
        FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x70416e73);
        writeSnapShot(&local_328.super_FArchive,
                      (level_info_t *)((long)&(wadlevelinfos.Array)->levelnum + lVar3));
        FPNGChunkArchive::~FPNGChunkArchive(&local_328);
        plVar2 = wadlevelinfos.Array;
        uVar1 = wadlevelinfos.Count;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x1b0;
    } while (uVar4 < uVar1);
  }
  if (TheDefaultLevelInfo.snapshot != (FCompressedMemFile *)0x0) {
    FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x704e7364);
    writeSnapShot(&local_328.super_FArchive,&TheDefaultLevelInfo);
    FPNGChunkArchive::~FPNGChunkArchive(&local_328);
    uVar1 = wadlevelinfos.Count;
  }
  if (uVar1 != 0) {
    lVar3 = 100;
    uVar4 = 0;
    this = (FPNGChunkArchive *)0x0;
    plVar2 = wadlevelinfos.Array;
    do {
      if (*(int *)((long)&plVar2->levelnum + lVar3) < 0) {
        if (this == (FPNGChunkArchive *)0x0) {
          this = (FPNGChunkArchive *)operator_new(0x300);
          FPNGChunkArchive::FPNGChunkArchive(this,file,0x74536976);
          plVar2 = wadlevelinfos.Array;
        }
        FArchive::operator<<(&this->super_FArchive,(FString *)((long)plVar2 + lVar3 + -0x5c));
        plVar2 = wadlevelinfos.Array;
        uVar1 = wadlevelinfos.Count;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x1b0;
    } while (uVar4 < uVar1);
    if (this != (FPNGChunkArchive *)0x0) {
      FString::FString((FString *)&local_328,(char *)"");
      FArchive::operator<<(&this->super_FArchive,(FString *)&local_328);
      (*(this->super_FArchive)._vptr_FArchive[1])(this);
      FString::~FString((FString *)&local_328);
    }
  }
  if (multiplayer == true) {
    FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x734c6372);
    lVar3 = 0;
    do {
      local_329 = (BYTE)SinglePlayerClass[lVar3];
      FArchive::operator<<(&local_328.super_FArchive,&local_329);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  }
  FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x734c6370);
  puVar5 = &DAT_00a602e0;
  lVar3 = 0;
  do {
    if (playeringame[lVar3] == true) {
      local_329 = (BYTE)lVar3;
      FArchive::operator<<(&local_328.super_FArchive,&local_329);
      FArchive::UserWriteClass(&local_328.super_FArchive,(PClass *)*puVar5);
    }
    local_329 = 0xff;
    FArchive::operator<<(&local_328.super_FArchive,&local_329);
    lVar3 = lVar3 + 1;
    puVar5 = puVar5 + 0x54;
  } while (lVar3 != 8);
  FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  return;
}

Assistant:

void G_WriteSnapshots (FILE *file)
{
	unsigned int i;

	for (i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].snapshot)
		{
			FPNGChunkArchive arc (file, SNAP_ID);
			writeSnapShot (arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}
	if (TheDefaultLevelInfo.snapshot != NULL)
	{
		FPNGChunkArchive arc (file, DSNP_ID);
		writeSnapShot(arc, &TheDefaultLevelInfo);
	}

	FPNGChunkArchive *arc = NULL;
	
	// Write out which levels have been visited
	for (i = 0; i < wadlevelinfos.Size(); ++i)
	{
		if (wadlevelinfos[i].flags & LEVEL_VISITED)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, VIST_ID);
			}
			(*arc) << wadlevelinfos[i].MapName;
		}
	}

	if (arc != NULL)
	{
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}

	// Store player classes to be used when spawning a random class
	if (multiplayer)
	{
		FPNGChunkArchive arc2 (file, RCLS_ID);
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			SBYTE cnum = SinglePlayerClass[i];
			arc2 << cnum;
		}
	}

	// Store player classes that are currently in use
	FPNGChunkArchive arc3 (file, PCLS_ID);
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		BYTE pnum;
		if (playeringame[i])
		{
			pnum = i;
			arc3 << pnum;
			arc3.UserWriteClass (players[i].cls);
		}
		pnum = 255;
		arc3 << pnum;
	}
}